

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O2

Ref_Man_t * Dar_ManRefStart(Aig_Man_t *pAig,Dar_RefPar_t *pPars)

{
  uint uVar1;
  void *pvVar2;
  Ref_Man_t *pRVar3;
  Vec_Vec_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int nWords;
  ulong uVar13;
  
  pRVar3 = (Ref_Man_t *)calloc(1,0xa0);
  pRVar3->pAig = pAig;
  pRVar3->pPars = pPars;
  uVar1 = pPars->nCutsMax;
  pVVar4 = (Vec_Vec_t *)malloc(0x10);
  uVar9 = 8;
  if (6 < uVar1 - 1) {
    uVar9 = uVar1;
  }
  pVVar4->nCap = uVar9;
  uVar12 = 0;
  if (uVar9 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)(int)uVar9 << 3);
  }
  pVVar4->pArray = ppvVar5;
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    pVVar6 = Vec_PtrAlloc(0);
    ppvVar5[uVar12] = pVVar6;
  }
  pVVar4->nSize = uVar1;
  pRVar3->vCuts = pVVar4;
  uVar1 = pPars->nLeafMax;
  uVar12 = (ulong)(uint)(1 << ((char)uVar1 - 5U & 0x1f));
  if ((int)uVar1 < 6) {
    uVar12 = 1;
  }
  pVVar6 = Vec_PtrAllocSimInfo(uVar1,(int)uVar12);
  uVar11 = 0;
  if ((int)uVar12 < 1) {
    uVar12 = 0;
  }
  uVar13 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar13 = uVar11;
  }
  for (; uVar11 != uVar13; uVar11 = uVar11 + 1) {
    pvVar2 = pVVar6->pArray[uVar11];
    if (uVar11 < 5) {
      for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
        *(undefined4 *)((long)pvVar2 + uVar10 * 4) = (&DAT_0080dd50)[uVar11];
      }
    }
    else {
      for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
        *(uint *)((long)pvVar2 + uVar10 * 4) =
             -(uint)((1 << ((char)uVar11 - 5U & 0x1f) & (uint)uVar10) != 0);
      }
    }
  }
  pRVar3->vTruthElem = pVVar6;
  nWords = 1 << ((char)pPars->nLeafMax - 5U & 0x1f);
  if (pPars->nLeafMax < 6) {
    nWords = 1;
  }
  pVVar6 = Vec_PtrAllocSimInfo(0x400,nWords);
  pRVar3->vTruthStore = pVVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x10000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(0x40000);
  pVVar7->pArray = piVar8;
  pRVar3->vMemory = pVVar7;
  pVVar6 = Vec_PtrAlloc(0x100);
  pRVar3->vCutNodes = pVVar6;
  pVVar6 = Vec_PtrAlloc(pPars->nLeafMax);
  pRVar3->vLeavesBest = pVVar6;
  (pRVar3->DecPars).nVarsMax = pPars->nLeafMax;
  (pRVar3->DecPars).fVerbose = pPars->fVerbose;
  (pRVar3->DecPars).fVeryVerbose = 0;
  return pRVar3;
}

Assistant:

Ref_Man_t * Dar_ManRefStart( Aig_Man_t * pAig, Dar_RefPar_t * pPars )
{
    Ref_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Ref_Man_t, 1 );
    memset( p, 0, sizeof(Ref_Man_t) );
    p->pAig         = pAig;
    p->pPars        = pPars;
    // other data
    p->vCuts        = Vec_VecStart( pPars->nCutsMax );
    p->vTruthElem   = Vec_PtrAllocTruthTables( pPars->nLeafMax );
    p->vTruthStore  = Vec_PtrAllocSimInfo( 1024, Kit_TruthWordNum(pPars->nLeafMax) );
    p->vMemory      = Vec_IntAlloc( 1 << 16 );
    p->vCutNodes    = Vec_PtrAlloc( 256 );
    p->vLeavesBest  = Vec_PtrAlloc( pPars->nLeafMax );
    // alloc bi-decomposition manager
    p->DecPars.nVarsMax = pPars->nLeafMax;
    p->DecPars.fVerbose = pPars->fVerbose;
    p->DecPars.fVeryVerbose = 0;
//    p->pManDec = Bdc_ManAlloc( &p->DecPars );
    return p;
}